

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test::
~SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test
          (SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, CallArgumentTypeMismatchThrows)
{
  std::string source = R"SRC(
  fn callTwice(f: function): void
  {
    f();
    f();
  }

  fn main(): f32
  {
    callTwice(12);
    ret 0;
  }
  )SRC";
  throwTest(source);
}